

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f5_get_stem_contributions_d3
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  vrna_param_t *p;
  int *piVar4;
  int *piVar5;
  code *pcVar6;
  code *pcVar7;
  char *pcVar8;
  short **ppsVar9;
  uint **ppuVar10;
  uchar uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int *piVar15;
  void *__ptr;
  void *__ptr_00;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int *stems;
  int *c;
  int turn;
  int *indx;
  int local_88;
  int ij;
  int i;
  uint type;
  uint **a2s;
  uint local_70;
  uint n_seq;
  uint s;
  uint n;
  short *ssj1;
  short *s3j1;
  short **S3;
  short **SS;
  short sj1;
  short *S;
  char *ptype;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar15 = (int *)vrna_alloc(j << 2);
  uVar13 = fc->length;
  p = fc->params;
  piVar4 = fc->jindx;
  piVar5 = (fc->matrices->field_2).field_0.c;
  uVar2 = (p->model_details).min_loop_size;
  indx._4_4_ = ~uVar2 + piVar4[j + -1] + j;
  pcVar6 = (code *)sc_wrapper->decomp_stem1;
  pcVar7 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    pcVar8 = (fc->field_23).field_0.ptype;
    sVar1 = (fc->field_23).field_0.sequence_encoding[j];
    iVar14 = j - uVar2;
    while (local_88 = iVar14 + -1, 1 < local_88) {
      piVar15[local_88] = 10000000;
      if ((piVar5[indx._4_4_] != 10000000) &&
         (uVar11 = (*evaluate)(1,j,iVar14 + -2,local_88,'\x13',hc_dat_local), uVar11 != '\0')) {
        uVar13 = vrna_get_ptype(indx._4_4_,pcVar8);
        iVar14 = piVar5[indx._4_4_];
        iVar12 = vrna_E_ext_stem(uVar13,-1,(int)sVar1,p);
        piVar15[local_88] = iVar14 + iVar12;
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar14 = local_88;
    }
    if (pcVar6 != (code *)0x0) {
      local_88 = j - uVar2;
      while (iVar14 = local_88, local_88 = iVar14 + -1, 1 < local_88) {
        if (piVar15[local_88] != 10000000) {
          iVar14 = (*pcVar6)(j,iVar14 + -2,local_88,sc_wrapper);
          piVar15[local_88] = iVar14 + piVar15[local_88];
        }
      }
    }
    piVar15[1] = 10000000;
    iVar14 = piVar4[j + -1] + 1;
    if ((piVar5[iVar14] != 10000000) &&
       (uVar11 = (*evaluate)(1,j,1,j + -1,'\x0e',hc_dat_local), uVar11 != '\0')) {
      uVar13 = vrna_get_ptype(iVar14,pcVar8);
      iVar14 = piVar5[iVar14];
      iVar12 = vrna_E_ext_stem(uVar13,-1,(int)sVar1,p);
      piVar15[1] = iVar14 + iVar12;
      if (pcVar7 != (code *)0x0) {
        iVar14 = (*pcVar7)(j,1,j + -1,sc_wrapper);
        piVar15[1] = iVar14 + piVar15[1];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar3 = (fc->field_23).field_1.n_seq;
    pcVar8 = (fc->field_23).field_0.ptype_pf_compat;
    ppsVar9 = (fc->field_23).field_1.S3;
    ppuVar10 = (fc->field_23).field_1.a2s;
    __ptr = vrna_alloc(uVar3 << 1);
    __ptr_00 = vrna_alloc(uVar3 << 1);
    for (local_70 = 0; local_70 < uVar3; local_70 = local_70 + 1) {
      if (ppuVar10[local_70][j + -1] < ppuVar10[local_70][uVar13]) {
        sVar1 = ppsVar9[local_70][j + -1];
      }
      else {
        sVar1 = -1;
      }
      *(short *)((long)__ptr + (ulong)local_70 * 2) = sVar1;
      *(undefined2 *)((long)__ptr_00 + (ulong)local_70 * 2) =
           *(undefined2 *)(*(long *)(pcVar8 + (ulong)local_70 * 8) + (long)(j + -1) * 2);
    }
    iVar14 = j - uVar2;
    while (local_88 = iVar14 + -1, 1 < local_88) {
      piVar15[local_88] = 10000000;
      if ((piVar5[indx._4_4_] != 10000000) &&
         (uVar11 = (*evaluate)(1,j,iVar14 + -2,local_88,'\x13',hc_dat_local), uVar11 != '\0')) {
        piVar15[local_88] = piVar5[indx._4_4_];
        for (local_70 = 0; local_70 < uVar3; local_70 = local_70 + 1) {
          uVar13 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar8 + (ulong)local_70 * 8) +
                                                    (long)local_88 * 2),
                                     (int)*(short *)((long)__ptr_00 + (ulong)local_70 * 2),
                                     &p->model_details);
          iVar14 = vrna_E_ext_stem(uVar13,-1,(int)*(short *)((long)__ptr + (ulong)local_70 * 2),p);
          piVar15[local_88] = iVar14 + piVar15[local_88];
        }
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar14 = local_88;
    }
    if (pcVar6 != (code *)0x0) {
      local_88 = j - uVar2;
      while (iVar14 = local_88, local_88 = iVar14 + -1, 1 < local_88) {
        if (piVar15[local_88] != 10000000) {
          iVar14 = (*pcVar6)(j,iVar14 + -2,local_88,sc_wrapper);
          piVar15[local_88] = iVar14 + piVar15[local_88];
        }
      }
    }
    piVar15[1] = 10000000;
    iVar14 = piVar4[j + -1];
    if ((piVar5[iVar14 + 1] != 10000000) &&
       (uVar11 = (*evaluate)(1,j,1,j + -1,'\x0e',hc_dat_local), uVar11 != '\0')) {
      piVar15[1] = piVar5[iVar14 + 1];
      for (local_70 = 0; local_70 < uVar3; local_70 = local_70 + 1) {
        uVar13 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar8 + (ulong)local_70 * 8) + 2),
                                   (int)*(short *)((long)__ptr_00 + (ulong)local_70 * 2),
                                   &p->model_details);
        iVar14 = vrna_E_ext_stem(uVar13,-1,(int)*(short *)((long)__ptr + (ulong)local_70 * 2),p);
        piVar15[1] = iVar14 + piVar15[1];
      }
      if (pcVar7 != (code *)0x0) {
        iVar14 = (*pcVar7)(j,1,j + -1,sc_wrapper);
        piVar15[1] = iVar14 + piVar15[1];
      }
    }
    free(__ptr);
    free(__ptr_00);
  }
  return piVar15;
}

Assistant:

int *
f5_get_stem_contributions_d3(vrna_fold_compound_t       *fc,
                             int                        j,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f5       *sc_wrapper)
{
  char                    *ptype;
  short                   *S, sj1, **SS, **S3, *s3j1, *ssj1;
  unsigned int            n, s, n_seq, **a2s, type;
  int                     i, ij, *indx, turn, *c, *stems;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  n     = fc->length;
  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = P->model_details.min_loop_size;
  ij    = indx[j - 1] + j - turn - 1;

  sc_spl_stem = sc_wrapper->decomp_stem1;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S     = fc->sequence_encoding;
      ptype = fc->ptype;
      sj1   = S[j];

      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM1, hc_dat_local))) {
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  = c[ij] +
                      vrna_E_ext_stem(type, -1, sj1, P);
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j - 1] + 1;

      if ((c[ij] != INF) && (evaluate(1, j, 1, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  = c[ij] +
                    vrna_E_ext_stem(type, -1, sj1, P);

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 1, j - 1, sc_wrapper);
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      SS    = fc->S;
      S3    = fc->S3;
      a2s   = fc->a2s;

      /* pre-compute S3[s][j - 1] */
      s3j1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      ssj1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++) {
        s3j1[s] = (a2s[s][j - 1] < a2s[s][n]) ? S3[s][j - 1] : -1;
        ssj1[s] = SS[s][j - 1];
      }

      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM1, hc_dat_local))) {
          stems[i] = c[ij];
          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(SS[s][i], ssj1[s], md);
            stems[i]  += vrna_E_ext_stem(type, -1, s3j1[s], P);
          }
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j - 1] + 1;

      if ((c[ij] != INF) && (evaluate(1, j, 1, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        stems[1] = c[ij];

        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(SS[s][1], ssj1[s], md);
          stems[1]  += vrna_E_ext_stem(type, -1, s3j1[s], P);
        }

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 1, j - 1, sc_wrapper);
      }

      free(s3j1);
      free(ssj1);

      break;
  }

  return stems;
}